

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::ChildElement(TiXmlHandle *this,int count)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  TiXmlNode *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int in_EDX;
  undefined4 in_register_00000034;
  int iVar6;
  
  if (*(long *)CONCAT44(in_register_00000034,count) != 0) {
    for (plVar1 = *(long **)(*(long *)CONCAT44(in_register_00000034,count) + 0x28);
        plVar1 != (long *)0x0; plVar1 = (long *)plVar1[9]) {
      lVar4 = (**(code **)(*plVar1 + 0x28))(plVar1);
      if (lVar4 != 0) {
        pTVar5 = (TiXmlNode *)(**(code **)(*plVar1 + 0x28))(plVar1);
        bVar2 = pTVar5 != (TiXmlNode *)0x0;
        if (in_EDX < 1 || pTVar5 == (TiXmlNode *)0x0) goto LAB_00170ebc;
        iVar6 = 0;
        goto LAB_00170e89;
      }
    }
  }
  goto LAB_00170ec0;
  while( true ) {
    iVar3 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[5])(pTVar5);
    pTVar5 = (TiXmlNode *)CONCAT44(extraout_var_00,iVar3);
    bVar2 = pTVar5 != (TiXmlNode *)0x0;
    if ((pTVar5 == (TiXmlNode *)0x0) || (iVar6 = iVar6 + 1, in_EDX <= iVar6)) break;
LAB_00170e89:
    do {
      pTVar5 = pTVar5->next;
      if (pTVar5 == (TiXmlNode *)0x0) goto LAB_00170ec0;
      iVar3 = (*(pTVar5->super_TiXmlBase)._vptr_TiXmlBase[5])(pTVar5);
    } while (CONCAT44(extraout_var,iVar3) == 0);
  }
LAB_00170ebc:
  if (bVar2) goto LAB_00170ec3;
LAB_00170ec0:
  pTVar5 = (TiXmlNode *)0x0;
LAB_00170ec3:
  this->node = pTVar5;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::ChildElement(int count) const {
	if (node) {
		int i;
		TiXmlElement* child = node->FirstChildElement();
		for (i = 0; child && i < count;
			child = child->NextSiblingElement(), ++i) {
			// nothing
		}
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}